

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall TPZTensor<double>::TPZTensor(TPZTensor<double> *this,TPZDecomposed *eigensystem)

{
  uint i;
  uint uVar1;
  double local_28;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_016acd20;
  local_28 = 0.0;
  TPZManVector<double,_6>::TPZManVector(&this->fData,6,&local_28);
  for (uVar1 = 0; uVar1 < 3;
      uVar1 = uVar1 + (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore[uVar1]
      ) {
    Add<double,double>(this,(eigensystem->fEigentensors).super_TPZVec<TPZTensor<double>_>.fStore +
                            uVar1,(eigensystem->fEigenvalues).super_TPZVec<double>.fStore + uVar1);
  }
  return;
}

Assistant:

TPZTensor(const TPZDecomposed &eigensystem) : fData(6, T(0.)) {
        unsigned int i;
        for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
            Add(eigensystem.fEigentensors[i], eigensystem.fEigenvalues[i]);
        }
#ifdef PZDEBUG
        if (i != 3) {
            DebugStop();
        }
#endif
    }